

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filesystem.cc
# Opt level: O0

void phosg::preadx(int fd,void *data,size_t size,off_t offset)

{
  int fd_00;
  io_error *piVar1;
  string local_60;
  ssize_t local_30;
  ssize_t ret_size;
  off_t offset_local;
  size_t size_local;
  void *data_local;
  int fd_local;
  
  ret_size = offset;
  offset_local = size;
  size_local = (size_t)data;
  data_local._4_4_ = fd;
  local_30 = pread(fd,data,size,offset);
  if (local_30 < 0) {
    piVar1 = (io_error *)__cxa_allocate_exception(0x20);
    io_error::io_error(piVar1,data_local._4_4_);
    __cxa_throw(piVar1,&io_error::typeinfo,io_error::~io_error);
  }
  if (local_30 != offset_local) {
    piVar1 = (io_error *)__cxa_allocate_exception(0x20);
    fd_00 = data_local._4_4_;
    string_printf_abi_cxx11_(&local_60,"expected %zu bytes, read %zd bytes",offset_local,local_30);
    io_error::io_error(piVar1,fd_00,(string *)&local_60);
    __cxa_throw(piVar1,&io_error::typeinfo,io_error::~io_error);
  }
  return;
}

Assistant:

void preadx(int fd, void* data, size_t size, off_t offset) {
  ssize_t ret_size = ::pread(fd, data, size, offset);
  if (ret_size < 0) {
    throw io_error(fd);
  } else if (ret_size != static_cast<ssize_t>(size)) {
    throw io_error(fd, string_printf("expected %zu bytes, read %zd bytes", size, ret_size));
  }
}